

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_toStringForNoParametersMultiCallCalledExpectedTimes_Test::testBody
          (TEST_MockExpectedCall_toStringForNoParametersMultiCallCalledExpectedTimes_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_e0 [48];
  undefined1 local_b0 [8];
  MockCheckedExpectedCall expectedCall;
  TEST_MockExpectedCall_toStringForNoParametersMultiCallCalledExpectedTimes_Test *this_local;
  
  expectedCall._152_8_ = this;
  MockCheckedExpectedCall::MockCheckedExpectedCall((MockCheckedExpectedCall *)local_b0,2);
  SimpleString::SimpleString((SimpleString *)(local_e0 + 0x20),"name");
  MockCheckedExpectedCall::withName
            ((MockCheckedExpectedCall *)local_b0,(SimpleString *)(local_e0 + 0x20));
  SimpleString::~SimpleString((SimpleString *)(local_e0 + 0x20));
  MockCheckedExpectedCall::callWasMade((MockCheckedExpectedCall *)local_b0,1);
  MockCheckedExpectedCall::callWasMade((MockCheckedExpectedCall *)local_b0,2);
  pUVar1 = UtestShell::getCurrent();
  MockCheckedExpectedCall::callToString((MockCheckedExpectedCall *)local_e0);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_e0);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"name -> no parameters (expected 2 calls, called 2 times)",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x233,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_e0);
  MockCheckedExpectedCall::~MockCheckedExpectedCall((MockCheckedExpectedCall *)local_b0);
  return;
}

Assistant:

TEST(MockExpectedCall, toStringForNoParametersMultiCallCalledExpectedTimes)
{
    MockCheckedExpectedCall expectedCall(2);
    expectedCall.withName("name");
    expectedCall.callWasMade(1);
    expectedCall.callWasMade(2);
    STRCMP_EQUAL("name -> no parameters (expected 2 calls, called 2 times)", expectedCall.callToString().asCharString());
}